

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmNinjaTargetGenerator::ExportObjectCompileCommand
          (cmNinjaTargetGenerator *this,string *language,string *sourceFileName,string *objectDir,
          string *objectFileName,string *objectFileDir,string *flags,string *defines,
          string *includes)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmGeneratorTarget *pcVar3;
  bool bVar4;
  int iVar5;
  cmGlobalNinjaGenerator *pcVar6;
  char *pcVar7;
  long *plVar8;
  undefined4 extraout_var;
  size_type *psVar9;
  ulong *puVar10;
  cmOutputConverter *outputConverter;
  string *sourceFile;
  pointer s;
  auto_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander;
  string cmdLine;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string escapedSourceFileName;
  RuleVariables compileObjectVars;
  string local_1c8;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  string local_170;
  string *local_150;
  long *local_148 [2];
  long local_138 [2];
  string *local_128;
  string *local_120;
  undefined1 local_118 [48];
  pointer local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  pointer local_50;
  pointer local_48;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  local_128 = objectFileName;
  local_120 = objectDir;
  local_118._0_8_ = local_118 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,"CMAKE_EXPORT_COMPILE_COMMANDS","");
  bVar4 = cmMakefile::IsOn(this_00,(string *)local_118);
  if ((undefined1 *)local_118._0_8_ != local_118 + 0x10) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  if (bVar4) {
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)local_118);
    local_e8 = (language->_M_dataplus)._M_p;
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    pcVar2 = (sourceFileName->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar2,pcVar2 + sourceFileName->_M_string_length);
    bVar4 = cmsys::SystemTools::FileIsFullPath((sourceFileName->_M_dataplus)._M_p);
    if (!bVar4) {
      pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
      pcVar7 = cmake::GetHomeOutputDirectory
                         ((pcVar6->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          CMakeInstance);
      cmsys::SystemTools::CollapseFullPath(&local_1a8,&local_170,pcVar7);
      std::__cxx11::string::operator=((string *)&local_170,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
    }
    local_150 = sourceFileName;
    cmOutputConverter::ConvertToOutputFormat
              (&local_1a8,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_170,SHELL);
    std::__cxx11::string::operator=((string *)&local_170,(string *)&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_170._M_dataplus._M_p;
    local_a8 = (local_128->_M_dataplus)._M_p;
    local_a0 = (local_120->_M_dataplus)._M_p;
    local_98 = (objectFileDir->_M_dataplus)._M_p;
    local_90 = (flags->_M_dataplus)._M_p;
    local_50 = (defines->_M_dataplus)._M_p;
    local_48 = (includes->_M_dataplus)._M_p;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_188.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar5 = std::__cxx11::string::compare((char *)language);
    if (iVar5 == 0) {
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_allocated_capacity =
           local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      paVar1 = &local_1c8.field_2;
      local_1c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c8,"CUDA_SEPARABLE_COMPILATION","");
      sourceFile = local_150;
      bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (bVar4) {
        local_1c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c8,"CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION","");
      }
      else {
        pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
        local_1c8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c8,"CUDA_PTX_COMPILATION","");
        bVar4 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_1c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        if (bVar4) {
          local_1c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,"CMAKE_CUDA_COMPILE_PTX_COMPILATION","");
        }
        else {
          local_1c8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c8,"CMAKE_CUDA_COMPILE_WHOLE_COMPILATION","");
        }
      }
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      pcVar7 = cmMakefile::GetRequiredDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_1a8);
      std::__cxx11::string::string((string *)&local_1c8,pcVar7,(allocator *)local_148);
      cmSystemTools::ExpandListArgument(&local_1c8,&local_188,false);
    }
    else {
      local_148[0] = local_138;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"CMAKE_","");
      sourceFile = local_150;
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_148,(ulong)(language->_M_dataplus)._M_p);
      psVar9 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_1c8.field_2._M_allocated_capacity = *psVar9;
        local_1c8.field_2._8_8_ = plVar8[3];
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      }
      else {
        local_1c8.field_2._M_allocated_capacity = *psVar9;
        local_1c8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1c8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar9;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c8);
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      puVar10 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_1a8.field_2._M_allocated_capacity = *puVar10;
        local_1a8.field_2._8_8_ = plVar8[3];
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar10;
        local_1a8._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_1a8._M_string_length = plVar8[1];
      *plVar8 = (long)puVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (local_148[0] != local_138) {
        operator_delete(local_148[0],local_138[0] + 1);
      }
      pcVar7 = cmMakefile::GetRequiredDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,&local_1a8);
      std::__cxx11::string::string((string *)&local_1c8,pcVar7,(allocator *)local_148);
      cmSystemTools::ExpandListArgument(&local_1c8,&local_188,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    iVar5 = (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              _vptr_cmLocalGenerator[5])();
    local_1c8._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar5);
    if (local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_188.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      s = local_188.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
      do {
        outputConverter =
             &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
              super_cmOutputConverter;
        if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
          outputConverter = (cmOutputConverter *)0x0;
        }
        cmRulePlaceholderExpander::ExpandRuleVariables
                  ((cmRulePlaceholderExpander *)local_1c8._M_dataplus._M_p,outputConverter,s,
                   (RuleVariables *)local_118);
        s = s + 1;
      } while (s != local_188.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
    }
    cmLocalNinjaGenerator::BuildCommandLine(&local_1a8,this->LocalGenerator,&local_188);
    pcVar6 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(this->LocalGenerator);
    cmGlobalNinjaGenerator::AddCXXCompileCommand(pcVar6,&local_1a8,sourceFile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    ::cm::auto_ptr<cmRulePlaceholderExpander>::~auto_ptr
              ((auto_ptr<cmRulePlaceholderExpander> *)&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_188);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmNinjaTargetGenerator::ExportObjectCompileCommand(
  std::string const& language, std::string const& sourceFileName,
  std::string const& objectDir, std::string const& objectFileName,
  std::string const& objectFileDir, std::string const& flags,
  std::string const& defines, std::string const& includes)
{
  if (!this->Makefile->IsOn("CMAKE_EXPORT_COMPILE_COMMANDS")) {
    return;
  }

  cmRulePlaceholderExpander::RuleVariables compileObjectVars;
  compileObjectVars.Language = language.c_str();

  std::string escapedSourceFileName = sourceFileName;

  if (!cmSystemTools::FileIsFullPath(sourceFileName.c_str())) {
    escapedSourceFileName = cmSystemTools::CollapseFullPath(
      escapedSourceFileName, this->GetGlobalGenerator()
                               ->GetCMakeInstance()
                               ->GetHomeOutputDirectory());
  }

  escapedSourceFileName = this->LocalGenerator->ConvertToOutputFormat(
    escapedSourceFileName, cmOutputConverter::SHELL);

  compileObjectVars.Source = escapedSourceFileName.c_str();
  compileObjectVars.Object = objectFileName.c_str();
  compileObjectVars.ObjectDir = objectDir.c_str();
  compileObjectVars.ObjectFileDir = objectFileDir.c_str();
  compileObjectVars.Flags = flags.c_str();
  compileObjectVars.Defines = defines.c_str();
  compileObjectVars.Includes = includes.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (language == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION");
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_PTX_COMPILATION");
    } else {
      cmdVar = std::string("CMAKE_CUDA_COMPILE_WHOLE_COMPILATION");
    }
    std::string compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar =
      std::string("CMAKE_") + language + "_COMPILE_OBJECT";
    std::string compileCmd =
      this->GetMakefile()->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  CM_AUTO_PTR<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  for (std::vector<std::string>::iterator i = compileCmds.begin();
       i != compileCmds.end(); ++i) {
    // no launcher for CMAKE_EXPORT_COMPILE_COMMANDS
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), *i,
                                                 compileObjectVars);
  }

  std::string cmdLine =
    this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  this->GetGlobalGenerator()->AddCXXCompileCommand(cmdLine, sourceFileName);
}